

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uv-common.c
# Opt level: O0

char * uv__strndup(char *s,size_t n)

{
  size_t local_30;
  size_t len;
  char *m;
  size_t n_local;
  char *s_local;
  
  local_30 = strlen(s);
  if (n < local_30) {
    local_30 = n;
  }
  s_local = (char *)uv__malloc(local_30 + 1);
  if (s_local == (char *)0x0) {
    s_local = (char *)0x0;
  }
  else {
    s_local[local_30] = '\0';
    memcpy(s_local,s,local_30);
  }
  return s_local;
}

Assistant:

char* uv__strndup(const char* s, size_t n) {
  char* m;
  size_t len = strlen(s);
  if (n < len)
    len = n;
  m = uv__malloc(len + 1);
  if (m == NULL)
    return NULL;
  m[len] = '\0';
  return memcpy(m, s, len);
}